

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::bitcast_glsl_op_abi_cxx11_
          (CompilerHLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  CompilerError *pCVar1;
  long in_RCX;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [37];
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d [20];
  allocator local_29 [9];
  SPIRType *in_type_local;
  SPIRType *out_type_local;
  CompilerHLSL *this_local;
  
  in_type_local = in_type;
  out_type_local = out_type;
  this_local = this;
  if ((in_type->basetype == UInt) && (*(int *)(in_RCX + 0x10) == 7)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((in_type->basetype == UInt64) && (*(int *)(in_RCX + 0x10) == 9)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((in_type->basetype == UInt) && (*(int *)(in_RCX + 0x10) == 0xd)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asuint",local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)local_29);
  }
  else if ((in_type->basetype == Int) && (*(int *)(in_RCX + 0x10) == 8)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((in_type->basetype == Int64) && (*(int *)(in_RCX + 0x10) == 10)) {
    (*(out_type->super_IVariant)._vptr_IVariant[0x13])(this,out_type,in_type,0);
  }
  else if ((in_type->basetype == Int) && (*(int *)(in_RCX + 0x10) == 0xd)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asint",local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  else if ((in_type->basetype == Float) && (*(int *)(in_RCX + 0x10) == 8)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asfloat",&local_3e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  else if ((in_type->basetype == Float) && (*(int *)(in_RCX + 0x10) == 7)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"asfloat",&local_3f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  else {
    if ((in_type->basetype == Int64) && (*(int *)(in_RCX + 0x10) == 0xe)) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"Double to Int64 is not supported in HLSL.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((in_type->basetype == UInt64) && (*(int *)(in_RCX + 0x10) == 0xe)) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"Double to UInt64 is not supported in HLSL.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((in_type->basetype == Double) && (*(int *)(in_RCX + 0x10) == 9)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"asdouble",&local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_40);
    }
    else if ((in_type->basetype == Double) && (*(int *)(in_RCX + 0x10) == 10)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"asdouble",&local_41);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else if (((in_type->basetype == Half) && (*(int *)(in_RCX + 0x10) == 8)) &&
            (*(int *)(in_RCX + 0x18) == 1)) {
      if ((out_type[0x1c].array.super_VectorView<unsigned_int>.buffer_size & 0x1000000) == 0) {
        *(undefined1 *)((long)&out_type[0x1c].array.super_VectorView<unsigned_int>.buffer_size + 3)
             = 1;
        Compiler::force_recompile((Compiler *)out_type);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"spvUnpackFloat2x16",&local_42);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_42);
    }
    else if (((in_type->basetype == UInt) && (*(int *)(in_RCX + 0x10) == 0xc)) &&
            (*(int *)(in_RCX + 0x18) == 2)) {
      if ((out_type[0x1c].array.super_VectorView<unsigned_int>.buffer_size & 0x1000000) == 0) {
        *(undefined1 *)((long)&out_type[0x1c].array.super_VectorView<unsigned_int>.buffer_size + 3)
             = 1;
        Compiler::force_recompile((Compiler *)out_type);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"spvPackFloat2x16",&local_43);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_43);
    }
    else if ((in_type->basetype == UShort) && (*(int *)(in_RCX + 0x10) == 0xc)) {
      if (out_type[0x1c].vecsize < 0x28) {
        pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar1,"Half to UShort requires Shader Model 4.");
        __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(out_type->super_IVariant)._vptr_IVariant[0x13])(local_88,out_type,in_type,0);
      ::std::operator+((char *)local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x422b6e
                      );
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_68);
      ::std::__cxx11::string::~string(local_68);
      ::std::__cxx11::string::~string(local_88);
    }
    else if ((in_type->basetype == Half) && (*(int *)(in_RCX + 0x10) == 6)) {
      if (out_type[0x1c].vecsize < 0x28) {
        pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar1,"UShort to Half requires Shader Model 4.");
        __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (*(out_type->super_IVariant)._vptr_IVariant[0x13])(local_c8,out_type,in_type,0);
      ::std::operator+((char *)local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x422b6e
                      );
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_a8);
      ::std::__cxx11::string::~string(local_a8);
      ::std::__cxx11::string::~string(local_c8);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_c9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
  }
  return this;
}

Assistant:

string CompilerHLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Int)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Int64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
		return "asuint";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::UInt)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::UInt64)
		return type_to_glsl(out_type);
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
		return "asint";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
		return "asfloat";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to Int64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		SPIRV_CROSS_THROW("Double to UInt64 is not supported in HLSL.");
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "asdouble";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvUnpackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
	{
		if (!requires_explicit_fp16_packing)
		{
			requires_explicit_fp16_packing = true;
			force_recompile();
		}
		return "spvPackFloat2x16";
	}
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("Half to UShort requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f32tof16";
	}
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
	{
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("UShort to Half requires Shader Model 4.");
		return "(" + type_to_glsl(out_type) + ")f16tof32";
	}
	else
		return "";
}